

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_filter.cpp
# Opt level: O0

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall duckdb::PhysicalFilter::ParamsToString_abi_cxx11_(PhysicalFilter *this)

{
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *unaff_retaddr;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *result;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  string local_38 [39];
  undefined1 local_11;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *estimated_cardinality;
  
  local_11 = 0;
  estimated_cardinality = in_RDI;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InsertionOrderPreservingMap(in_stack_ffffffffffffff60);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffff60);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[7])(local_38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"__expression__",&local_69);
  this_00 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ::std::__cxx11::string::operator=((string *)this_00,local_38);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  ::std::__cxx11::string::~string(local_38);
  PhysicalOperator::SetEstimatedCardinality(unaff_retaddr,(idx_t)estimated_cardinality);
  return in_RDI;
}

Assistant:

InsertionOrderPreservingMap<string> PhysicalFilter::ParamsToString() const {
	InsertionOrderPreservingMap<string> result;
	result["__expression__"] = expression->GetName();
	SetEstimatedCardinality(result, estimated_cardinality);
	return result;
}